

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

int menu_dynamic_select(menu_conflict *m)

{
  ui_event uVar1;
  int local_44;
  void *pvStack_40;
  int cursor;
  menu_entry *entry;
  ui_event_type local_24;
  ui_event e;
  menu_conflict *m_local;
  
  uVar1 = menu_select(m,0,true);
  local_44 = m->cursor;
  local_24 = uVar1.type;
  if (local_24 == EVT_ESCAPE) {
    m_local._4_4_ = -1;
  }
  else {
    pvStack_40 = menu_priv(m);
    for (; local_44 != 0; local_44 = local_44 + -1) {
      pvStack_40 = *(void **)((long)pvStack_40 + 0x10);
      if (pvStack_40 == (void *)0x0) {
        __assert_fail("entry",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                      ,0x486,"int menu_dynamic_select(struct menu *)");
      }
    }
    m_local._4_4_ = *(int *)((long)pvStack_40 + 8);
  }
  return m_local._4_4_;
}

Assistant:

int menu_dynamic_select(struct menu *m)
{
	ui_event e = menu_select(m, 0, true);
	struct menu_entry *entry;
	int cursor = m->cursor;

	if (e.type == EVT_ESCAPE)
		return -1;

	for (entry = menu_priv(m); cursor; cursor--) {
		entry = entry->next;
		assert(entry);
	}	

	return entry->value;
}